

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O2

uint8_t hex4_to_digest(char data)

{
  int iVar1;
  undefined3 in_register_00000039;
  
  if (data < ':') {
    iVar1 = 0x30;
  }
  else if ((byte)data < 0x47) {
    iVar1 = 0x37;
  }
  else {
    if (0x66 < (byte)data) {
      return '\0';
    }
    iVar1 = 0x57;
  }
  if (CONCAT31(in_register_00000039,data) < iVar1) {
    return '\0';
  }
  return data - (char)iVar1;
}

Assistant:

static uint8_t hex4_to_digest(char data)
{
	char base = '0';

	if (data > '9') {
		if (data > 'F') {
			if (data > 'f')
				return 0;
			base = 'a' - 10;
		} else {
			base = 'A' - 10;
		}
	}

	if (data < base)
		return 0;

	return data - base;
}